

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::
step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)4>_>
          (xpath_ast_node *this,xpath_node_set_raw *ns,long *xn,xpath_allocator *alloc,byte once)

{
  xml_node_struct *pxVar1;
  bool bVar2;
  xml_node_struct *n;
  xml_node_struct *n_00;
  
  pxVar1 = (xml_node_struct *)*xn;
  if (((pxVar1 != (xml_node_struct *)0x0 && xn[1] == 0) &&
      (n_00 = pxVar1->first_child, n_00 != (xml_node_struct *)0x0)) &&
     (bVar2 = step_push(this,ns,n_00,alloc), (once & bVar2) == 0)) {
    do {
      n = n_00->first_child;
      if (n == (xml_node_struct *)0x0) {
        while (n = n_00->next_sibling, n == (xml_node_struct *)0x0) {
          n_00 = n_00->parent;
          if (n_00 == pxVar1) {
            return;
          }
        }
      }
      bVar2 = step_push(this,ns,n,alloc);
      n_00 = n;
    } while ((bVar2 & once) != 1);
  }
  return;
}

Assistant:

void step_fill(xpath_node_set_raw& ns, const xpath_node& xn, xpath_allocator* alloc, bool once, T v)
		{
			const axis_t axis = T::axis;
			const bool axis_has_attributes = (axis == axis_ancestor || axis == axis_ancestor_or_self || axis == axis_descendant_or_self || axis == axis_following || axis == axis_parent || axis == axis_preceding || axis == axis_self);

			if (xn.node())
				step_fill(ns, xn.node().internal_object(), alloc, once, v);
			else if (axis_has_attributes && xn.attribute() && xn.parent())
				step_fill(ns, xn.attribute().internal_object(), xn.parent().internal_object(), alloc, once, v);
		}